

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encrypted_client_hello.cc
# Opt level: O1

bool __thiscall
bssl::ssl_select_ech_config
          (bssl *this,SSL_HANDSHAKE *hs,Span<unsigned_char> out_enc,size_t *out_enc_len)

{
  bssl *this_00;
  ushort uVar1;
  uint16_t uVar2;
  uchar *puVar3;
  size_t sVar4;
  bool bVar5;
  uint16_t uVar6;
  int iVar7;
  pointer __p;
  bssl *pbVar8;
  EVP_HPKE_KEM *kem;
  bssl *extraout_RAX;
  EVP_HPKE_AEAD *aead;
  uint8_t *info;
  size_t info_len;
  ECHConfig *__p_00;
  undefined8 uVar9;
  long lVar10;
  uint local_138;
  bool supported;
  uint16_t local_132;
  undefined4 local_130;
  undefined4 local_12c;
  EVP_HPKE_AEAD *local_128;
  uint local_11c;
  uint16_t kdf_id;
  CBS cbs_1;
  EVP_HPKE_AEAD *local_b8;
  EVP_HPKE_KDF *local_b0;
  CBS child;
  ECHConfig ech_config;
  CBS cbs;
  
  *(size_t *)out_enc.size_ = 0;
  if (0x303 < *(ushort *)(this + 0x1e)) {
    cbs.len = *(size_t *)(*(long *)(this + 8) + 0x100);
    if (cbs.len != 0) {
      cbs.data = *(uint8_t **)(*(long *)(this + 8) + 0xf8);
      iVar7 = CBS_get_u16_length_prefixed(&cbs,&child);
      if ((iVar7 == 0) || (local_130 = 0, child.len == 0)) {
        local_130 = 0;
        local_138._0_1_ = 0;
      }
      else {
        local_138._0_1_ = 0;
        if (cbs.len == 0) {
          this_00 = this + 0x6a0;
          local_138 = (uint)this_00;
          pbVar8 = this_00;
          do {
            local_130 = (undefined4)CONCAT71((int7)((ulong)pbVar8 >> 8),child.len == 0);
            if (child.len == 0) break;
            ech_config.cipher_suites.data_ = (uchar *)0x0;
            ech_config.cipher_suites.size_ = 0;
            ech_config.public_name.data_ = (uchar *)0x0;
            ech_config.public_name.size_ = 0;
            ech_config.public_key.data_ = (uchar *)0x0;
            ech_config.public_key.size_ = 0;
            ech_config.raw.data_ = (uchar *)0x0;
            ech_config.raw.size_ = 0;
            ech_config.kem_id = 0;
            ech_config.maximum_name_length = '\0';
            ech_config.config_id = '\0';
            uVar9 = 0;
            bVar5 = parse_ech_config(&child,&ech_config,&supported,false);
            if (bVar5) {
              kem = EVP_hpke_x25519_hkdf_sha256();
              sVar4 = ech_config.cipher_suites.size_;
              puVar3 = ech_config.cipher_suites.data_;
              local_12c = (undefined4)CONCAT71((int7)((ulong)uVar9 >> 8),1);
              if ((supported == true) && (ech_config.kem_id == 0x20)) {
                uVar1 = *(ushort *)(*(long *)(*(long *)this + 8) + 0x10d);
                if ((uVar1 >> 0xb & 1) == 0) {
                  local_11c = EVP_has_aes_hardware();
                }
                else {
                  local_11c = uVar1 >> 0xc & 1;
                }
                cbs_1.data = puVar3;
                cbs_1.len = sVar4;
                if (sVar4 == 0) {
                  local_128 = (EVP_HPKE_AEAD *)0x0;
                }
                else {
                  local_128 = (EVP_HPKE_AEAD *)0x0;
                  do {
                    iVar7 = CBS_get_u16(&cbs_1,&kdf_id);
                    bVar5 = true;
                    if ((iVar7 != 0) &&
                       (iVar7 = CBS_get_u16(&cbs_1,&local_132), uVar2 = local_132, iVar7 != 0)) {
                      lVar10 = 0;
                      do {
                        aead = (EVP_HPKE_AEAD *)(**(code **)((long)&kSupportedAEADs + lVar10))();
                        uVar6 = EVP_HPKE_AEAD_id(aead);
                        if (uVar6 == uVar2) goto LAB_0013691c;
                        lVar10 = lVar10 + 8;
                      } while (lVar10 != 0x18);
                      aead = (EVP_HPKE_AEAD *)0x0;
LAB_0013691c:
                      bVar5 = false;
                      if (((aead != (EVP_HPKE_AEAD *)0x0) && (kdf_id == 1)) &&
                         ((local_128 == (EVP_HPKE_AEAD *)0x0 ||
                          ((bVar5 = false, local_11c == 0 && (local_132 == 3)))))) {
                        bVar5 = false;
                        local_128 = aead;
                      }
                    }
                    if (bVar5) goto LAB_001369a4;
                  } while (cbs_1.len != 0);
                }
                if (local_128 == (EVP_HPKE_AEAD *)0x0) {
LAB_001369a4:
                  bVar5 = false;
                }
                else {
                  local_b0 = EVP_hpke_hkdf_sha256();
                  bVar5 = true;
                  local_b8 = local_128;
                }
                if (bVar5) {
                  CBB_zero((CBB *)&cbs_1);
                  iVar7 = CBB_init((CBB *)&cbs_1,ech_config.raw.size_ + 8);
                  if (((iVar7 == 0) ||
                      (iVar7 = CBB_add_bytes((CBB *)&cbs_1,"tls ech",8), iVar7 == 0)) ||
                     (iVar7 = CBB_add_bytes((CBB *)&cbs_1,ech_config.raw.data_,ech_config.raw.size_)
                     , sVar4 = ech_config.public_key.size_, puVar3 = ech_config.public_key.data_,
                     iVar7 == 0)) {
LAB_00136acb:
                    local_138 = 0;
                  }
                  else {
                    info = CBB_data((CBB *)&cbs_1);
                    info_len = CBB_len((CBB *)&cbs_1);
                    iVar7 = EVP_HPKE_CTX_setup_sender
                                      ((EVP_HPKE_CTX *)(this + 0x350),(uint8_t *)hs,
                                       (size_t *)out_enc.size_,(size_t)out_enc.data_,kem,local_b0,
                                       local_b8,puVar3,sVar4,info,info_len);
                    if ((iVar7 == 0) ||
                       (bVar5 = SSLTranscript::Init((SSLTranscript *)(this + 0x238)), !bVar5))
                    goto LAB_00136acb;
                    __p_00 = New<bssl::ECHConfig,bssl::ECHConfig>(&ech_config);
                    _kdf_id = (ECHConfig *)0x0;
                    std::__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter>::reset
                              ((__uniq_ptr_impl<bssl::ECHConfig,_bssl::internal::Deleter> *)this_00,
                               __p_00);
                    std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr
                              ((unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter> *)&kdf_id);
                    local_138 = (uint)((_Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>
                                       )*(tuple<bssl::ECHConfig_*,_bssl::internal::Deleter> *)
                                         this_00 !=
                                      (_Tuple_impl<0UL,_bssl::ECHConfig_*,_bssl::internal::Deleter>)
                                      0x0);
                  }
                  CBB_cleanup((CBB *)&cbs_1);
                  local_12c = 0;
                }
              }
            }
            else {
              local_12c = 0;
              local_138 = 0;
            }
            OPENSSL_free(ech_config.raw.data_);
            pbVar8 = extraout_RAX;
          } while ((char)local_12c != '\0');
        }
      }
      if ((char)local_130 == '\0') goto LAB_00136b07;
    }
  }
  local_138._0_1_ = 1;
LAB_00136b07:
  return (bool)((byte)local_138 & 1);
}

Assistant:

bool ssl_select_ech_config(SSL_HANDSHAKE *hs, Span<uint8_t> out_enc,
                           size_t *out_enc_len) {
  *out_enc_len = 0;
  if (hs->max_version < TLS1_3_VERSION) {
    // ECH requires TLS 1.3.
    return true;
  }

  if (!hs->config->client_ech_config_list.empty()) {
    CBS cbs = CBS(hs->config->client_ech_config_list);
    CBS child;
    if (!CBS_get_u16_length_prefixed(&cbs, &child) ||  //
        CBS_len(&child) == 0 ||                        //
        CBS_len(&cbs) > 0) {
      return false;
    }
    // Look for the first ECHConfig with supported parameters.
    while (CBS_len(&child) > 0) {
      ECHConfig ech_config;
      bool supported;
      if (!parse_ech_config(&child, &ech_config, &supported,
                            /*all_extensions_mandatory=*/false)) {
        return false;
      }
      const EVP_HPKE_KEM *kem = EVP_hpke_x25519_hkdf_sha256();
      const EVP_HPKE_KDF *kdf;
      const EVP_HPKE_AEAD *aead;
      if (supported &&  //
          ech_config.kem_id == EVP_HPKE_DHKEM_X25519_HKDF_SHA256 &&
          select_ech_cipher_suite(&kdf, &aead, ech_config.cipher_suites,
                                  hs->ssl->config->aes_hw_override
                                      ? hs->ssl->config->aes_hw_override_value
                                      : EVP_has_aes_hardware())) {
        ScopedCBB info;
        static const uint8_t kInfoLabel[] = "tls ech";  // includes trailing NUL
        if (!CBB_init(info.get(), sizeof(kInfoLabel) + ech_config.raw.size()) ||
            !CBB_add_bytes(info.get(), kInfoLabel, sizeof(kInfoLabel)) ||
            !CBB_add_bytes(info.get(), ech_config.raw.data(),
                           ech_config.raw.size())) {
          return false;
        }

        if (!EVP_HPKE_CTX_setup_sender(
                hs->ech_hpke_ctx.get(), out_enc.data(), out_enc_len,
                out_enc.size(), kem, kdf, aead, ech_config.public_key.data(),
                ech_config.public_key.size(), CBB_data(info.get()),
                CBB_len(info.get())) ||
            !hs->inner_transcript.Init()) {
          return false;
        }

        hs->selected_ech_config = MakeUnique<ECHConfig>(std::move(ech_config));
        return hs->selected_ech_config != nullptr;
      }
    }
  }

  return true;
}